

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Array * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Array,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                  *args_2,bool *args_3,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_4)

{
  Array *this_00;
  Array *in_RCX;
  LocationRange *in_R8;
  Fodder *in_R9;
  Array *r;
  Fodder *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc7;
  Elements *in_stack_ffffffffffffffc8;
  
  this_00 = (Array *)operator_new(0xb8);
  Array::Array(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7,
               in_stack_ffffffffffffffb8);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)this_00,
             (value_type *)this_00);
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }